

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_01.hpp
# Opt level: O0

result_type __thiscall
boost::random::detail::new_uniform_01<double>::operator()
          (new_uniform_01<double> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *eng)

{
  result_type_conflict1 rVar1;
  result_type_conflict1 rVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  result_type result;
  result_type factor;
  linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *in_stack_ffffffffffffffe0;
  
  do {
    auVar4 = in_ZMM0._0_16_;
    rVar1 = linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U>::max();
    rVar2 = linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U>::min();
    auVar4 = vcvtusi2sd_avx512f(auVar4,rVar1 - rVar2);
    auVar5._0_8_ = 1.0 / (auVar4._0_8_ + 1.0);
    auVar5._8_8_ = 0;
    auVar4 = auVar5;
    uVar3 = linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U>::operator()
                      (in_stack_ffffffffffffffe0);
    rVar1 = linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U>::min();
    auVar4 = vcvtusi2sd_avx512f(auVar4,uVar3 - rVar1);
    in_stack_ffffffffffffffe0 =
         (linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *)
         (auVar4._0_8_ * auVar5._0_8_);
    in_ZMM0 = ZEXT1664(ZEXT816(0x3ff0000000000000));
  } while (1.0 <= (double)in_stack_ffffffffffffffe0);
  return (result_type)in_stack_ffffffffffffffe0;
}

Assistant:

result_type operator()(Engine& eng) {
    for (;;) {
      typedef typename Engine::result_type base_result;
      result_type factor = result_type(1) /
              (result_type((eng.max)()-(eng.min)()) +
               result_type(std::numeric_limits<base_result>::is_integer ? 1 : 0));
      result_type result = result_type(eng() - (eng.min)()) * factor;
      if (result < result_type(1))
        return result;
    }
  }